

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall Parser::FinishBackgroundRegExpNodes(Parser *this)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [8];
  RegexPattern *pRVar4;
  code *pcVar5;
  NodeDList *pNVar6;
  DListBase<ParseNode_*,_RealCount> *pDVar7;
  bool bVar8;
  bool bVar9;
  undefined4 *puVar10;
  ParseNode **ppPVar11;
  ParseNodeRegExp *pPVar12;
  BackgroundParseItem *pBVar13;
  undefined1 local_60 [8];
  Iterator __iter_2;
  undefined1 local_40 [8];
  Iterator __iter;
  
  if (this->m_isInBackground == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b0,"(!this->IsBackgroundParser())","!this->IsBackgroundParser()");
    if (!bVar8) goto LAB_00e7bff8;
    *puVar10 = 0;
  }
  if (this->fastScannedRegExpNodes == (NodeDList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b1,"(this->fastScannedRegExpNodes)","this->fastScannedRegExpNodes");
    if (!bVar8) goto LAB_00e7bff8;
    *puVar10 = 0;
  }
  if (this->backgroundParseItems == (BackgroundParseItem *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b2,"(this->backgroundParseItems != nullptr)",
                       "this->backgroundParseItems != nullptr");
    if (!bVar8) {
LAB_00e7bff8:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
  pBVar13 = this->backgroundParseItems;
  if (pBVar13 != (BackgroundParseItem *)0x0) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      local_40 = (undefined1  [8])pBVar13->regExpNodes;
      __iter.list = (DListBase<ParseNode_*,_RealCount> *)local_40;
      if (local_40 != (undefined1  [8])0x0) {
        while( true ) {
          if (__iter.list == (DListBase<ParseNode_*,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                               ,0x66,"(current != nullptr)","current != nullptr");
            if (!bVar8) goto LAB_00e7bff8;
            *puVar10 = 0;
          }
          __iter.list = ((__iter.list)->super_DListNodeBase<ParseNode_*>).next.list;
          if ((undefined1  [8])__iter.list == local_40) break;
          ppPVar11 = DListBase<ParseNode_*,_RealCount>::Iterator::Data((Iterator *)local_40);
          pPVar12 = ParseNode::AsParseNodeRegExp(*ppPVar11);
          if (pPVar12->regexPattern != (RegexPattern *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x2bf,"(pnode->AsParseNodeRegExp()->regexPattern == nullptr)",
                               "pnode->AsParseNodeRegExp()->regexPattern == nullptr");
            if (!bVar8) goto LAB_00e7bff8;
            *puVar10 = 0;
          }
        }
      }
      pBVar13 = pBVar13->nextItem;
    } while (pBVar13 != (BackgroundParseItem *)0x0);
  }
  pBVar13 = this->backgroundParseItems;
  local_40 = (undefined1  [8])this->fastScannedRegExpNodes;
  __iter.list = (DListBase<ParseNode_*,_RealCount> *)local_40;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00e7bc29:
  if (__iter.list == (DListBase<ParseNode_*,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar8) goto LAB_00e7bff8;
    *puVar10 = 0;
  }
  __iter.list = ((__iter.list)->super_DListNodeBase<ParseNode_*>).next.list;
  if ((undefined1  [8])__iter.list == local_40) {
    __iter.list = (DListBase<ParseNode_*,_RealCount> *)0x0;
    pBVar13 = this->backgroundParseItems;
    if (pBVar13 != (BackgroundParseItem *)0x0) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        local_40 = (undefined1  [8])pBVar13->regExpNodes;
        __iter.list = (DListBase<ParseNode_*,_RealCount> *)local_40;
        if (local_40 != (undefined1  [8])0x0) {
          while( true ) {
            if (__iter.list == (DListBase<ParseNode_*,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                                 ,0x66,"(current != nullptr)","current != nullptr");
              if (!bVar8) goto LAB_00e7bff8;
              *puVar10 = 0;
            }
            __iter.list = ((__iter.list)->super_DListNodeBase<ParseNode_*>).next.list;
            if ((undefined1  [8])__iter.list == local_40) break;
            ppPVar11 = DListBase<ParseNode_*,_RealCount>::Iterator::Data((Iterator *)local_40);
            pPVar12 = ParseNode::AsParseNodeRegExp(*ppPVar11);
            if (pPVar12->regexPattern == (RegexPattern *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                 ,0x306,"(pnode->AsParseNodeRegExp()->regexPattern != nullptr)",
                                 "pnode->AsParseNodeRegExp()->regexPattern != nullptr");
              if (!bVar8) goto LAB_00e7bff8;
              *puVar10 = 0;
            }
          }
        }
        pBVar13 = pBVar13->nextItem;
      } while (pBVar13 != (BackgroundParseItem *)0x0);
    }
    return;
  }
  __iter_2.current =
       (NodeBase *)DListBase<ParseNode_*,_RealCount>::Iterator::Data((Iterator *)local_40);
  if (((ParseNode *)((__iter_2.current)->next).base)->nop != knopRegExp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2d0,"(pnodeFgnd->nop == knopRegExp)","pnodeFgnd->nop == knopRegExp");
    if (!bVar8) goto LAB_00e7bff8;
    *puVar10 = 0;
  }
  pPVar12 = ParseNode::AsParseNodeRegExp((ParseNode *)((__iter_2.current)->next).base);
  if (pPVar12->regexPattern == (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2d1,"(pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr)",
                       "pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr");
    if (!bVar8) goto LAB_00e7bff8;
    *puVar10 = 0;
  }
  bVar8 = false;
  while (pBVar13 != (BackgroundParseItem *)0x0) {
    auVar3 = (undefined1  [8])pBVar13->regExpNodes;
    pNVar6 = (NodeDList *)auVar3;
    if (auVar3 == (undefined1  [8])0x0) {
      pBVar13 = pBVar13->nextItem;
    }
    else {
      do {
        __iter_2.list = &pNVar6->super_DListBase<ParseNode_*,_RealCount>;
        local_60 = auVar3;
        if (__iter_2.list == (DListBase<ParseNode_*,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar9) goto LAB_00e7bff8;
          *puVar10 = 0;
        }
        __iter_2.list = ((__iter_2.list)->super_DListNodeBase<ParseNode_*>).next.list;
        pDVar7 = (DListBase<ParseNode_*,_RealCount> *)0x0;
        if ((undefined1  [8])__iter_2.list == local_60) break;
        ppPVar11 = DListBase<ParseNode_*,_RealCount>::Iterator::Data((Iterator *)local_60);
        if ((*ppPVar11)->nop != knopRegExp) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0x2e3,"(pnodeBgnd->nop == knopRegExp)","pnodeBgnd->nop == knopRegExp")
          ;
          if (!bVar9) goto LAB_00e7bff8;
          *puVar10 = 0;
        }
        uVar1 = *(uint *)((long)&(((__iter_2.current)->next).base)->next + 4);
        uVar2 = (*ppPVar11)->ichMin;
        if ((uVar1 <= uVar2) && (bVar8 = true, uVar1 == uVar2)) {
          if (*(charcount_t *)&(((__iter_2.current)->next).base)->prev != (*ppPVar11)->ichLim) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x2eb,"(pnodeFgnd->ichLim == pnodeBgnd->ichLim)",
                               "pnodeFgnd->ichLim == pnodeBgnd->ichLim");
            if (!bVar9) goto LAB_00e7bff8;
            *puVar10 = 0;
          }
          pPVar12 = ParseNode::AsParseNodeRegExp((ParseNode *)((__iter_2.current)->next).base);
          pRVar4 = pPVar12->regexPattern;
          pPVar12 = ParseNode::AsParseNodeRegExp(*ppPVar11);
          pPVar12->regexPattern = pRVar4;
        }
        auVar3 = local_60;
        pNVar6 = (NodeDList *)__iter_2.list;
        pDVar7 = __iter_2.list;
      } while (uVar2 < uVar1);
      __iter_2.list = pDVar7;
      if (bVar8) goto LAB_00e7bc29;
      pBVar13 = pBVar13->nextItem;
    }
  }
  pBVar13 = (BackgroundParseItem *)0x0;
  goto LAB_00e7bc29;
}

Assistant:

void Parser::FinishBackgroundRegExpNodes()
{
    // We have a list of RegExp nodes that we saw on the UI thread in functions we're parallel parsing,
    // and for each background job we have a list of RegExp nodes for which we couldn't allocate patterns.
    // We need to copy the pattern pointers from the UI thread nodes to the corresponding nodes on the
    // background nodes.
    // There may be UI thread nodes for which there are no background thread equivalents, because the UI thread
    // has to assume that the background thread won't defer anything.

    // Note that because these lists (and the list of background jobs) are SList's built by prepending, they are
    // all in reverse lexical order.

    Assert(!this->IsBackgroundParser());
    Assert(this->fastScannedRegExpNodes);
    Assert(this->backgroundParseItems != nullptr);

    BackgroundParseItem *currBackgroundItem;

#if DBG
    for (currBackgroundItem = this->backgroundParseItems;
        currBackgroundItem;
        currBackgroundItem = currBackgroundItem->GetNext())
    {
        if (currBackgroundItem->RegExpNodeList())
        {
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnode, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnode->AsParseNodeRegExp()->regexPattern == nullptr);
            }
            NEXT_DLIST_ENTRY;
        }
    }
#endif

    // Hook up the patterns allocated on the main thread to the nodes created on the background thread.
    // Walk the list of foreground nodes, advancing through the work items and looking up each item.
    // Note that the background thread may have chosen to defer a given RegEx literal, so not every foreground
    // node will have a matching background node. Doesn't matter for correctness.
    // (It's inefficient, of course, to have to restart the inner loop from the beginning of the work item's
    // list, but it should be unusual to have many RegExes in a single work item's chunk of code. Figure out how
    // to start the inner loop from a known internal node within the list if that turns out to be important.)
    currBackgroundItem = this->backgroundParseItems;
    FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnodeFgnd, this->fastScannedRegExpNodes)
    {
        Assert(pnodeFgnd->nop == knopRegExp);
        Assert(pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr);
        bool quit = false;

        while (!quit)
        {
            // Find the next work item with a RegEx in it.
            while (currBackgroundItem && currBackgroundItem->RegExpNodeList() == nullptr)
            {
                currBackgroundItem = currBackgroundItem->GetNext();
            }
            if (!currBackgroundItem)
            {
                break;
            }

            // Walk the RegExps in the work item.
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnodeBgnd, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnodeBgnd->nop == knopRegExp);

                if (pnodeFgnd->ichMin <= pnodeBgnd->ichMin)
                {
                    // Either we found a match, or the next background node is past the foreground node.
                    // In any case, we can stop searching.
                    if (pnodeFgnd->ichMin == pnodeBgnd->ichMin)
                    {
                        Assert(pnodeFgnd->ichLim == pnodeBgnd->ichLim);
                        pnodeBgnd->AsParseNodeRegExp()->regexPattern = pnodeFgnd->AsParseNodeRegExp()->regexPattern;
                    }
                    quit = true;
                    break;
                }
            }
            NEXT_DLIST_ENTRY;

            if (!quit)
            {
                // Need to advance to the next work item.
                currBackgroundItem = currBackgroundItem->GetNext();
            }
        }
    }
    NEXT_DLIST_ENTRY;

#if DBG
    for (currBackgroundItem = this->backgroundParseItems;
        currBackgroundItem;
        currBackgroundItem = currBackgroundItem->GetNext())
    {
        if (currBackgroundItem->RegExpNodeList())
        {
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnode, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnode->AsParseNodeRegExp()->regexPattern != nullptr);
            }
            NEXT_DLIST_ENTRY;
        }
    }
#endif
}